

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool google::protobuf::anon_unknown_6::IsIndexInHasBitSet
               (uint32_t *has_bit_set,uint32_t has_bit_index)

{
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_40;
  Voidify local_29;
  uint local_28;
  uint local_24;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint32_t *puStack_10;
  uint32_t has_bit_index_local;
  uint32_t *has_bit_set_local;
  
  absl_log_internal_check_op_result._4_4_ = has_bit_index;
  puStack_10 = has_bit_set;
  local_24 = absl::lts_20250127::log_internal::GetReferenceableValue(has_bit_index);
  local_28 = absl::lts_20250127::log_internal::GetReferenceableValue(0xffffffff);
  local_20 = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,unsigned_int>
                       (&local_24,&local_28,"has_bit_index != ~0u");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x6c1,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  return (puStack_10[absl_log_internal_check_op_result._4_4_ >> 5] >>
          ((byte)absl_log_internal_check_op_result._4_4_ & 0x1f) & 1) != 0;
}

Assistant:

bool IsIndexInHasBitSet(const uint32_t* has_bit_set, uint32_t has_bit_index) {
  ABSL_DCHECK_NE(has_bit_index, ~0u);
  return ((has_bit_set[has_bit_index / 32] >> (has_bit_index % 32)) &
          static_cast<uint32_t>(1)) != 0;
}